

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vbo.cpp
# Opt level: O0

void __thiscall
vera::Vbo::load(Vbo *this,
               vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
               *_vertices)

{
  VertexLayout *this_00;
  vec<2,_float,_(glm::qualifier)0> *_vertices_00;
  size_type sVar1;
  VertexLayout *vertexLayout;
  allocator local_69;
  value_type local_68;
  undefined1 local_30 [8];
  vector<vera::VertexAttrib,_std::allocator<vera::VertexAttrib>_> attribs;
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  *_vertices_local;
  Vbo *this_local;
  
  attribs.super__Vector_base<vera::VertexAttrib,_std::allocator<vera::VertexAttrib>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)_vertices;
  std::vector<vera::VertexAttrib,_std::allocator<vera::VertexAttrib>_>::vector
            ((vector<vera::VertexAttrib,_std::allocator<vera::VertexAttrib>_> *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"position",&local_69);
  local_68.size = 2;
  local_68.type = 0x1406;
  local_68.normalized = '\0';
  local_68.offset = (GLvoid *)0x0;
  std::vector<vera::VertexAttrib,_std::allocator<vera::VertexAttrib>_>::push_back
            ((vector<vera::VertexAttrib,_std::allocator<vera::VertexAttrib>_> *)local_30,&local_68);
  VertexAttrib::~VertexAttrib(&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  this_00 = (VertexLayout *)operator_new(0x28);
  VertexLayout::VertexLayout
            (this_00,(vector<vera::VertexAttrib,_std::allocator<vera::VertexAttrib>_> *)local_30);
  setVertexLayout(this,this_00);
  _vertices_00 = std::
                 vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                 ::data((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                         *)attribs.
                           super__Vector_base<vera::VertexAttrib,_std::allocator<vera::VertexAttrib>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
  sVar1 = std::
          vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
          ::size((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                  *)attribs.
                    super__Vector_base<vera::VertexAttrib,_std::allocator<vera::VertexAttrib>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
  addVertices(this,(GLbyte *)_vertices_00,(int)sVar1);
  std::vector<vera::VertexAttrib,_std::allocator<vera::VertexAttrib>_>::~vector
            ((vector<vera::VertexAttrib,_std::allocator<vera::VertexAttrib>_> *)local_30);
  return;
}

Assistant:

void Vbo::load(const std::vector<glm::vec2> &_vertices) {
    std::vector<VertexAttrib> attribs;
    attribs.push_back({"position", 2, GL_FLOAT, false, 0});
    VertexLayout* vertexLayout = new VertexLayout(attribs);
    setVertexLayout( vertexLayout );

    addVertices((GLbyte*)_vertices.data(), _vertices.size());
}